

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCMPrint.cpp
# Opt level: O3

void processElements(XSNamedMap<xercesc_4_0::XSObject> *xsElements)

{
  long *plVar1;
  char *in_RAX;
  XSObject *xsObject;
  wchar16 *pwVar2;
  char *pcVar3;
  size_t sVar4;
  long lVar5;
  BaseRefVectorOf<xercesc_4_0::XSObject> *this;
  XMLSize_t getAt;
  StrX local_38;
  
  if ((xsElements != (XSNamedMap<xercesc_4_0::XSObject> *)0x0) &&
     (this = *(BaseRefVectorOf<xercesc_4_0::XSObject> **)(xsElements + 0x10),
     *(long *)(this + 0x10) != 0)) {
    getAt = 0;
    local_38.fLocalForm = in_RAX;
    do {
      xsObject = xercesc_4_0::BaseRefVectorOf<xercesc_4_0::XSObject>::elementAt(this,getAt);
      printBasic(xsObject,"Element");
      plVar1 = *(long **)(xsObject + 0x38);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Content Model",0xd);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\tType:\t",7);
      if ((int)plVar1[5] == 0x10) {
        lVar5 = 7;
        pcVar3 = "\tSimple\n";
      }
      else {
        lVar5 = 8;
        pcVar3 = "\tComplex\n";
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar3 + 1,lVar5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\tName:\t",7);
      pwVar2 = (wchar16 *)(**(code **)(*plVar1 + 0x10))(plVar1);
      pcVar3 = (char *)xercesc_4_0::XMLString::transcode
                                 (pwVar2,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      local_38.fLocalForm = pcVar3;
      if (pcVar3 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10b0b8);
      }
      else {
        sVar4 = strlen(pcVar3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar3,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
      StrX::~StrX(&local_38);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\n--------------------------------------------",0x2d);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
      std::ostream::put(-0x48);
      std::ostream::flush();
      getAt = getAt + 1;
      this = *(BaseRefVectorOf<xercesc_4_0::XSObject> **)(xsElements + 0x10);
    } while (getAt < *(ulong *)(this + 0x10));
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"no elements\n\n",0xd);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
  std::ostream::put(-0x48);
  std::ostream::flush();
  return;
}

Assistant:

void processElements(XSNamedMap<XSObject> *xsElements)
{
    if (!xsElements || xsElements->getLength() == 0) {
        std::cout << "no elements\n\n"  << std::endl;
        return;
    }
    for (XMLSize_t i=0; i < xsElements->getLength(); i++) {
        XSElementDeclaration *xsElement = (XSElementDeclaration *)xsElements->item(i);
        printBasic(xsElement, "Element");

        // Content Model
        XSTypeDefinition *xsTypeDef = xsElement->getTypeDefinition();
        std::cout << "Content Model" << "\n";
        std::cout << "\tType:\t";
        if (xsTypeDef->getTypeCategory() == XSTypeDefinition::SIMPLE_TYPE) {
            std::cout << "Simple\n";
        } else {
            std::cout << "Complex\n";
        }
        std::cout << "\tName:\t"
            << StrX(xsTypeDef->getName()) << "\n";

        std::cout << "\n--------------------------------------------" << std::endl;
    }
}